

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_xmi_midiout.cpp
# Opt level: O0

void __thiscall XMISong::ProcessInitialMetaEvents(XMISong *this)

{
  BYTE BVar1;
  TrackInfo *this_00;
  DWORD DVar2;
  bool bVar3;
  DWORD len;
  BYTE event;
  TrackInfo *track;
  XMISong *this_local;
  
  this_00 = this->CurrSong;
  while( true ) {
    bVar3 = false;
    if (((this_00->Finished & 1U) == 0) && (bVar3 = false, this_00->EventP < this_00->EventLen - 3))
    {
      bVar3 = this_00->EventChunk[this_00->EventP] == 0xff;
    }
    if (!bVar3) break;
    BVar1 = this_00->EventChunk[this_00->EventP + 1];
    this_00->EventP = this_00->EventP + 2;
    DVar2 = TrackInfo::ReadVarLen(this_00);
    if ((this_00->EventP + (ulong)DVar2 <= this_00->EventLen) && (BVar1 == '/')) {
      this_00->Finished = true;
    }
    this_00->EventP = (ulong)DVar2 + this_00->EventP;
  }
  if (this_00->EventLen - 1 <= this_00->EventP) {
    this_00->Finished = true;
  }
  return;
}

Assistant:

void XMISong::ProcessInitialMetaEvents ()
{
	TrackInfo *track = CurrSong;
	BYTE event;
	DWORD len;

	while (!track->Finished &&
			track->EventP < track->EventLen - 3 &&
			track->EventChunk[track->EventP] == MIDI_META)
	{
		event = track->EventChunk[track->EventP+1];
		track->EventP += 2;
		len = track->ReadVarLen();
		if (track->EventP + len <= track->EventLen && event == MIDI_META_EOT)
		{
			track->Finished = true;
		}
		track->EventP += len;
	}
	if (track->EventP >= track->EventLen - 1)
	{
		track->Finished = true;
	}
}